

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

CURLcode Curl_ssl_cfilter_remove(Curl_easy *data,int sockindex,_Bool send_shutdown)

{
  curl_trc_feat *pcVar1;
  void *pvVar2;
  CURLcode CVar3;
  int iVar4;
  timediff_t timeout_ms;
  uint *puVar5;
  byte bVar6;
  CURLcode CVar7;
  int iVar8;
  Curl_cfilter *cf;
  Curl_cfilter *cf_00;
  _Bool done;
  _Bool local_45;
  int local_44;
  Curl_cfilter *local_40;
  undefined8 local_38;
  
  if (data->conn == (connectdata *)0x0) {
    cf = (Curl_cfilter *)0x0;
    cf_00 = cf;
  }
  else {
    cf = data->conn->cfilter[sockindex];
    cf_00 = cf;
  }
  while( true ) {
    if (cf == (Curl_cfilter *)0x0) {
      return CURLE_OK;
    }
    if (cf->cft == &Curl_cft_ssl) break;
    cf = cf->next;
  }
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
      ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) &&
     (0 < Curl_cft_ssl.log_level)) {
    Curl_trc_cf_infof(data,cf,"shutdown and remove SSL, start");
  }
  Curl_shutdown_start(data,sockindex,(curltime *)0x0);
  if ((cf->field_0x24 & 2) == 0) {
    pvVar2 = cf->ctx;
    local_38 = *(undefined8 *)((long)pvVar2 + 0x38);
    *(Curl_easy **)((long)pvVar2 + 0x38) = data;
    local_45 = false;
    iVar8 = -0xb;
    local_44 = sockindex;
    local_40 = cf_00;
    do {
      iVar8 = iVar8 + 1;
      if (iVar8 == 0) break;
      timeout_ms = Curl_shutdown_timeleft(cf->conn,cf->sockindex,(curltime *)0x0);
      if (timeout_ms < 0) {
        Curl_failf(data,"SSL shutdown timeout");
        CVar3 = CURLE_OPERATION_TIMEDOUT;
        cf_00 = local_40;
        sockindex = local_44;
        goto LAB_0017106c;
      }
      CVar3 = (*Curl_ssl->shut_down)(cf,data,send_shutdown,&local_45);
      if (CVar3 != CURLE_OK) goto LAB_00171036;
      if (local_45 != false) break;
      if (*(int *)((long)pvVar2 + 0x58) != 0) {
        iVar4 = Curl_conn_cf_poll(cf,data,timeout_ms);
        if (iVar4 < 0) {
          puVar5 = (uint *)__errno_location();
          Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar5);
          CVar3 = CURLE_RECV_ERROR;
          goto LAB_00171036;
        }
        if (iVar4 == 0) {
          Curl_failf(data,"SSL shutdown timeout");
          CVar3 = CURLE_OPERATION_TIMEDOUT;
          goto LAB_00171036;
        }
      }
    } while (local_45 != true);
    CVar3 = CURLE_OK;
LAB_00171036:
    *(undefined8 *)((long)cf->ctx + 0x38) = local_38;
    bVar6 = 2;
    if (CVar3 == CURLE_OK) {
      bVar6 = local_45 * '\x02';
    }
    cf->field_0x24 = cf->field_0x24 & 0xfd | bVar6;
    cf_00 = local_40;
    sockindex = local_44;
  }
  else {
    local_45 = true;
    CVar3 = CURLE_OK;
  }
LAB_0017106c:
  Curl_shutdown_clear(data,sockindex);
  CVar7 = CURLE_SSL_SHUTDOWN_FAILED;
  if ((local_45 & 1U) != 0) {
    CVar7 = CURLE_OK;
  }
  if (CVar3 != CURLE_OK) {
    CVar7 = CVar3;
  }
  Curl_conn_cf_discard_sub(cf_00,cf,data,false);
  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
     (((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)) &&
      (0 < cf->cft->log_level)))) {
    Curl_trc_cf_infof(data,cf,"shutdown and remove SSL, done -> %d",(ulong)CVar7);
  }
  return CVar7;
}

Assistant:

CURLcode Curl_ssl_cfilter_remove(struct Curl_easy *data,
                                 int sockindex, bool send_shutdown)
{
  struct Curl_cfilter *cf, *head;
  CURLcode result = CURLE_OK;

  head = data->conn? data->conn->cfilter[sockindex] : NULL;
  for(cf = head; cf; cf = cf->next) {
    if(cf->cft == &Curl_cft_ssl) {
      bool done;
      CURL_TRC_CF(data, cf, "shutdown and remove SSL, start");
      Curl_shutdown_start(data, sockindex, NULL);
      result = vtls_shutdown_blocking(cf, data, send_shutdown, &done);
      Curl_shutdown_clear(data, sockindex);
      if(!result && !done) /* blocking failed? */
        result = CURLE_SSL_SHUTDOWN_FAILED;
      Curl_conn_cf_discard_sub(head, cf, data, FALSE);
      CURL_TRC_CF(data, cf, "shutdown and remove SSL, done -> %d", result);
      break;
    }
  }
  return result;
}